

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O3

void VP8YuvToRgba444432_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  char cVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined4 uVar39;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  ushort uVar48;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  undefined1 auVar49 [16];
  ushort uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined6 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar46 [16];
  
  auVar37 = _DAT_0014a8f0;
  auVar36 = _DAT_0014a8e0;
  auVar35 = _DAT_0014a8c0;
  auVar34 = _DAT_0014a8b0;
  auVar33 = _DAT_0014a890;
  auVar32 = _DAT_0014a880;
  auVar31 = _DAT_0014a7e0;
  auVar30 = _DAT_0014a7d0;
  uVar38 = 0xfffffffffffffff8;
  do {
    uVar41 = *(undefined8 *)(y + uVar38 + 8);
    auVar21[10] = 0;
    auVar21._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar21[0xb] = (char)((ulong)uVar41 >> 0x28);
    auVar24[9] = (char)((ulong)uVar41 >> 0x20);
    auVar24._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar24._10_2_ = auVar21._10_2_;
    auVar27._9_3_ = auVar24._9_3_;
    auVar27._0_9_ = (unkuint9)0;
    auVar61._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar27._8_4_,(char)((ulong)uVar41 >> 0x18))) << 0x38,6);
    auVar61[0] = (char)((ulong)uVar41 >> 0x10);
    auVar61._11_5_ = 0;
    auVar57._1_12_ = SUB1612(auVar61 << 0x28,4);
    auVar57[0] = (char)((ulong)uVar41 >> 8);
    auVar57._13_3_ = 0;
    auVar44._1_14_ = SUB1614(auVar57 << 0x18,2);
    auVar44[0] = (char)uVar41;
    auVar44[0xf] = 0;
    auVar57 = pmulhuw(auVar44 << 8,auVar32);
    uVar41 = *(undefined8 *)(u + uVar38 + 8);
    auVar22[10] = 0;
    auVar22._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar22[0xb] = (char)((ulong)uVar41 >> 0x28);
    auVar25[9] = (char)((ulong)uVar41 >> 0x20);
    auVar25._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar25._10_2_ = auVar22._10_2_;
    auVar28._9_3_ = auVar25._9_3_;
    auVar28._0_9_ = (unkuint9)0;
    auVar18._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar28._8_4_,(char)((ulong)uVar41 >> 0x18))) << 0x38,6);
    auVar18[0] = (char)((ulong)uVar41 >> 0x10);
    auVar18._11_5_ = 0;
    auVar17._1_12_ = SUB1612(auVar18 << 0x28,4);
    auVar17[0] = (char)((ulong)uVar41 >> 8);
    auVar17._13_3_ = 0;
    auVar49._1_14_ = SUB1614(auVar17 << 0x18,2);
    auVar49[0] = (char)uVar41;
    auVar49[0xf] = 0;
    uVar41 = *(undefined8 *)(v + uVar38 + 8);
    auVar23[10] = 0;
    auVar23._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar23[0xb] = (char)((ulong)uVar41 >> 0x28);
    auVar26[9] = (char)((ulong)uVar41 >> 0x20);
    auVar26._0_9_ = SUB169((undefined1  [16])0x0,0);
    auVar26._10_2_ = auVar23._10_2_;
    auVar29._9_3_ = auVar26._9_3_;
    auVar29._0_9_ = (unkuint9)0;
    auVar20._1_10_ =
         SUB1610(ZEXT516(CONCAT41(auVar29._8_4_,(char)((ulong)uVar41 >> 0x18))) << 0x38,6);
    auVar20[0] = (char)((ulong)uVar41 >> 0x10);
    auVar20._11_5_ = 0;
    auVar19._1_12_ = SUB1612(auVar20 << 0x28,4);
    auVar19[0] = (char)((ulong)uVar41 >> 8);
    auVar19._13_3_ = 0;
    auVar60._1_14_ = SUB1614(auVar19 << 0x18,2);
    auVar60[0] = (char)uVar41;
    auVar60[0xf] = 0;
    auVar44 = pmulhuw(auVar60 << 8,auVar33);
    auVar45._0_2_ = auVar44._0_2_ + auVar57._0_2_ + -0x379a;
    auVar45._2_2_ = auVar44._2_2_ + auVar57._2_2_ + -0x379a;
    auVar45._4_2_ = auVar44._4_2_ + auVar57._4_2_ + -0x379a;
    auVar45._6_2_ = auVar44._6_2_ + auVar57._6_2_ + -0x379a;
    auVar45._8_2_ = auVar44._8_2_ + auVar57._8_2_ + -0x379a;
    auVar45._10_2_ = auVar44._10_2_ + auVar57._10_2_ + -0x379a;
    auVar45._12_2_ = auVar44._12_2_ + auVar57._12_2_ + -0x379a;
    auVar45._14_2_ = auVar44._14_2_ + auVar57._14_2_ + -0x379a;
    auVar61 = pmulhuw(auVar49 << 8,auVar34);
    auVar60 = pmulhuw(auVar60 << 8,auVar35);
    auVar44 = pmulhuw(auVar49 << 8,auVar36);
    auVar44 = paddusw(auVar44,auVar57);
    auVar58._0_2_ = (auVar57._0_2_ - (auVar60._0_2_ + auVar61._0_2_)) + 0x2204;
    auVar58._2_2_ = (auVar57._2_2_ - (auVar60._2_2_ + auVar61._2_2_)) + 0x2204;
    auVar58._4_2_ = (auVar57._4_2_ - (auVar60._4_2_ + auVar61._4_2_)) + 0x2204;
    auVar58._6_2_ = (auVar57._6_2_ - (auVar60._6_2_ + auVar61._6_2_)) + 0x2204;
    auVar58._8_2_ = (auVar57._8_2_ - (auVar60._8_2_ + auVar61._8_2_)) + 0x2204;
    auVar58._10_2_ = (auVar57._10_2_ - (auVar60._10_2_ + auVar61._10_2_)) + 0x2204;
    auVar58._12_2_ = (auVar57._12_2_ - (auVar60._12_2_ + auVar61._12_2_)) + 0x2204;
    auVar58._14_2_ = (auVar57._14_2_ - (auVar60._14_2_ + auVar61._14_2_)) + 0x2204;
    auVar49 = psubusw(auVar44,auVar37);
    auVar44 = psraw(auVar45,6);
    auVar60 = psraw(auVar58,6);
    sVar2 = auVar44._0_2_;
    sVar3 = auVar44._2_2_;
    sVar4 = auVar44._4_2_;
    sVar5 = auVar44._6_2_;
    sVar6 = auVar44._8_2_;
    sVar7 = auVar44._10_2_;
    sVar8 = auVar44._12_2_;
    sVar9 = auVar44._14_2_;
    cVar1 = (0 < sVar9) * (sVar9 < 0x100) * auVar44[0xe] - (0xff < sVar9);
    sVar9 = auVar60._0_2_;
    sVar10 = auVar60._2_2_;
    sVar11 = auVar60._4_2_;
    sVar12 = auVar60._6_2_;
    sVar13 = auVar60._8_2_;
    sVar14 = auVar60._10_2_;
    sVar15 = auVar60._12_2_;
    sVar16 = auVar60._14_2_;
    uVar48 = auVar49._0_2_ >> 6;
    uVar50 = auVar49._2_2_ >> 6;
    uVar51 = auVar49._4_2_ >> 6;
    uVar52 = auVar49._6_2_ >> 6;
    uVar53 = auVar49._8_2_ >> 6;
    uVar54 = auVar49._10_2_ >> 6;
    uVar55 = auVar49._12_2_ >> 6;
    uVar56 = auVar49._14_2_ >> 6;
    auVar59._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11((uVar56 != 0) *
                                                                         (uVar56 < 0x100) *
                                                                         (char)uVar56 -
                                                                         (0xff < uVar56),cVar1),
                                                                (uVar55 != 0) * (uVar55 < 0x100) *
                                                                (char)uVar55 - (0xff < uVar55)),
                                                       (0 < sVar8) * (sVar8 < 0x100) * auVar44[0xc]
                                                       - (0xff < sVar8)),
                                              (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 -
                                              (0xff < uVar54)),
                                     (0 < sVar7) * (sVar7 < 0x100) * auVar44[10] - (0xff < sVar7)),
                            (uVar53 != 0) * (uVar53 < 0x100) * (char)uVar53 - (0xff < uVar53)),
                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar44[8] - (0xff < sVar6),cVar1)) >> 8
         );
    auVar59[7] = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    auVar59[6] = (0 < sVar5) * (sVar5 < 0x100) * auVar44[6] - (0xff < sVar5);
    auVar59[5] = (uVar51 != 0) * (uVar51 < 0x100) * (char)uVar51 - (0xff < uVar51);
    auVar59[4] = (0 < sVar4) * (sVar4 < 0x100) * auVar44[4] - (0xff < sVar4);
    auVar59[3] = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    auVar59[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar44[2] - (0xff < sVar3);
    auVar59[1] = (uVar48 != 0) * (uVar48 < 0x100) * (char)uVar48 - (0xff < uVar48);
    auVar59[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar44[0] - (0xff < sVar2);
    uVar48 = CONCAT11(0xff,(0 < sVar9) * (sVar9 < 0x100) * auVar60[0] - (0xff < sVar9));
    uVar39 = CONCAT13(0xff,CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar60[2] - (0xff < sVar10),
                                    uVar48));
    uVar40 = CONCAT15(0xff,CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar60[4] - (0xff < sVar11),
                                    uVar39));
    uVar41 = CONCAT17(0xff,CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar60[6] - (0xff < sVar12),
                                    uVar40));
    auVar42._0_10_ =
         CONCAT19(0xff,CONCAT18((0 < sVar13) * (sVar13 < 0x100) * auVar60[8] - (0xff < sVar13),
                                uVar41));
    auVar42[10] = (0 < sVar14) * (sVar14 < 0x100) * auVar60[10] - (0xff < sVar14);
    auVar42[0xb] = 0xff;
    auVar43[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar60[0xc] - (0xff < sVar15);
    auVar43._0_12_ = auVar42;
    auVar43[0xd] = 0xff;
    auVar46[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar60[0xe] - (0xff < sVar16);
    auVar46._0_14_ = auVar43;
    auVar46[0xf] = 0xff;
    auVar47._0_2_ = uVar48 >> 4;
    auVar47._2_2_ = (ushort)((uint)uVar39 >> 0x14);
    auVar47._4_2_ = (ushort)((uint6)uVar40 >> 0x24);
    auVar47._6_2_ = (ushort)((ulong)uVar41 >> 0x34);
    auVar47._8_2_ = (ushort)((unkuint10)auVar42._0_10_ >> 0x44);
    auVar47._10_2_ = auVar42._10_2_ >> 4;
    auVar47._12_2_ = auVar43._12_2_ >> 4;
    auVar47._14_2_ = auVar46._14_2_ >> 4;
    *(undefined1 (*) [16])(dst + uVar38 * 2 + 0x10) = auVar47 & auVar31 | auVar59 & auVar30;
    uVar38 = uVar38 + 8;
  } while (uVar38 < 0x18);
  return;
}

Assistant:

void VP8YuvToRgba444432_SSE2(const uint8_t* y, const uint8_t* u,
                             const uint8_t* v, uint8_t* dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4444_SSE2(&R, &G, &B, &kAlpha, dst);
  }
}